

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_hmi.cpp
# Opt level: O3

bool midi_processor::process_hmi
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,midi_container *p_out)

{
  ulong uVar1;
  const_iterator cVar2;
  byte bVar3;
  ushort uVar4;
  byte bVar5;
  int iVar6;
  uint *puVar7;
  ulong uVar8;
  pointer puVar9;
  pointer puVar10;
  ulong uVar11;
  event_type p_type;
  unsigned_long uVar12;
  uint uVar13;
  pointer puVar14;
  pointer puVar15;
  const_iterator end;
  size_t p_data_count;
  unsigned_long p_timestamp;
  unsigned_long p_timestamp_00;
  pointer puVar16;
  unsigned_long uVar17;
  uint uVar18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  midi_track track;
  vector<unsigned_int,_std::allocator<unsigned_int>_> track_offsets;
  byte local_101;
  const_iterator local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  midi_track local_d8;
  midi_container *local_c0;
  midi_event local_b8;
  uint local_74;
  ulong local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar15 = (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar13 = *(uint *)(puVar15 + 0xe8);
  uVar11 = (long)(p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)puVar15;
  if (uVar13 < uVar11) {
    uVar4 = *(ushort *)(puVar15 + 0xe4);
    bVar5 = puVar15[0xe6];
    bVar3 = puVar15[0xe7];
    uVar18 = (uint)bVar5 * 0x10000 + (uint)uVar4 | (uint)bVar3 << 0x18;
    uVar8 = (ulong)uVar18;
    if (uVar13 + uVar18 * 4 <= uVar11) {
      local_100._M_current = puVar15 + uVar13;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c0 = p_out;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_68,uVar8);
      puVar9 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = uVar8;
      if (uVar18 != 0) {
        do {
          puVar7 = (uint *)((long)local_100._M_current + 4);
          *puVar9 = *(uint *)local_100._M_current;
          uVar11 = uVar11 - 1;
          puVar9 = puVar9 + 1;
          local_100._M_current = (uchar *)puVar7;
        } while (uVar11 != 0);
      }
      midi_container::initialize(local_c0,1,0xc0);
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      midi_event::midi_event(&local_b8,0,extended,0,hmp_default_tempo,5);
      midi_track::add_event(&local_d8,&local_b8);
      if (local_b8.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.m_ext_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      midi_event::midi_event(&local_b8,0,extended,0,end_of_track,2);
      midi_track::add_event(&local_d8,&local_b8);
      if (local_b8.m_ext_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.m_ext_data.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.m_ext_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      midi_container::add_track(local_c0,&local_d8);
      std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_d8.m_events);
      uVar13 = (uint)bVar3 << 0x18 | (uint)bVar5 * 0x10000 | (uint)uVar4;
      if (uVar13 == 0) {
        uVar11 = 0;
      }
      else {
        uVar11 = 0;
        local_40 = (ulong)uVar13;
        local_38 = p_file;
        do {
          puVar15 = (pointer)(ulong)local_68.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar11];
          uVar1 = uVar11 + 1;
          if (uVar1 < uVar8) {
            puVar16 = (pointer)(ulong)(local_68.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar1] -
                                      local_68.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar11]);
            puVar14 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar10 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            puVar14 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar10 = (local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            puVar16 = puVar10 + (-(long)puVar14 - (long)puVar15);
          }
          if ((((((puVar10 + -(long)puVar14 <= puVar15) ||
                 (puVar10 + -(long)puVar14 < puVar16 + (long)puVar15)) || (puVar16 < (pointer)0xd))
               || ((puVar15 = puVar15 + (long)puVar14, *puVar15 != 'H' || (puVar15[1] != 'M')))) ||
              (((puVar15[2] != 'I' || ((puVar15[3] != '-' || (puVar15[4] != 'M')))) ||
               (puVar15[5] != 'I')))) ||
             ((((puVar15[6] != 'D' || (puVar15[7] != 'I')) || (puVar15[8] != 'T')) ||
              (((puVar15[9] != 'R' || (puVar15[10] != 'A')) ||
               ((puVar15[0xb] != 'C' || (puVar15[0xc] != 'K')))))))) break;
          local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.m_events.super__Vector_base<midi_event,_std::allocator<midi_event>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cVar2._M_current = local_100._M_current;
          local_70 = uVar8;
          local_50 = uVar1;
          local_48 = uVar11;
          if (puVar16 < (pointer)0x4f) {
switchD_0010c850_caseD_11:
            local_100._M_current = cVar2._M_current;
            std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_d8.m_events);
            uVar11 = local_48;
            uVar8 = local_70;
            break;
          }
          uVar13 = *(uint *)(puVar15 + 0x4b);
          uVar11 = (ulong)uVar13;
          if ((uVar11 != 0) && ((pointer)(ulong)(uVar13 + 1) < puVar16)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8,2);
            *(undefined2 *)
             local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start = *(undefined2 *)(puVar15 + uVar11);
            uVar8 = (ulong)local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[1];
            cVar2._M_current = local_100._M_current;
            if (puVar16 < (pointer)(ulong)(uVar13 + local_f8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1] + 2))
            goto switchD_0010c850_caseD_11;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8,uVar8 + 2);
            if (uVar8 != 0) {
              memmove(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start + 2,puVar15 + uVar11 + 2,uVar8);
              uVar8 = uVar8 + 2;
              do {
                if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar8 - 1] != 0x20) {
                  *local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = 0xff;
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[1] = 1;
                  midi_event::midi_event
                            (&local_b8,0,extended,0,
                             local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,uVar8 & 0xffffffff);
                  midi_track::add_event(&local_d8,&local_b8);
                  if (local_b8.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_b8.m_ext_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_b8.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_b8.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  break;
                }
                uVar8 = uVar8 - 1;
              } while (uVar8 != 2);
            }
          }
          cVar2._M_current = local_100._M_current;
          if (puVar16 < (pointer)0x5b) goto switchD_0010c850_caseD_11;
          local_100._M_current = puVar15 + *(uint *)(puVar15 + 0x57);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_f8,3);
          end._M_current = puVar15 + (long)puVar16;
          if (local_100._M_current != end._M_current) {
            local_101 = 0xff;
            p_timestamp = 0;
            uVar12 = 0;
            do {
              uVar13 = decode_delta(&local_100,end);
              uVar18 = (int)p_timestamp + uVar13;
              uVar17 = uVar12;
              if ((uint)uVar12 < uVar18) {
                uVar17 = (unsigned_long)uVar18;
              }
              if (0xffff < uVar13) {
                uVar17 = uVar12;
              }
              p_timestamp = (ulong)uVar18;
              if (0xffff < uVar13) {
                p_timestamp = uVar12;
              }
              cVar2._M_current = local_100._M_current;
              if (local_100._M_current == end._M_current) goto switchD_0010c850_caseD_11;
              cVar2._M_current = local_100._M_current + 1;
              *local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start = *local_100._M_current;
              bVar5 = *local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar12 = uVar17;
              if (bVar5 == 0xf0) {
                local_100._M_current = cVar2._M_current;
                uVar13 = decode_delta(&local_100,end);
                cVar2._M_current = local_100._M_current;
                if ((-1 < (int)uVar13) &&
                   (uVar11 = (ulong)uVar13,
                   (long)uVar11 <= (long)end._M_current - (long)local_100._M_current)) {
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_f8,(ulong)(uVar13 + 1));
                  if (uVar13 != 0) {
                    memmove(local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1,local_100._M_current,uVar11
                           );
                  }
                  local_100._M_current = local_100._M_current + uVar11;
                  midi_event::midi_event
                            (&local_b8,p_timestamp,extended,0,
                             local_f8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(ulong)(uVar13 + 1));
                  midi_track::add_event(&local_d8,&local_b8);
                  goto LAB_0010c927;
                }
                goto switchD_0010c850_caseD_11;
              }
              if (bVar5 == 0xfe) {
                if (cVar2._M_current == end._M_current) goto switchD_0010c850_caseD_11;
                puVar7 = (uint *)(local_100._M_current + 2);
                local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[1] = (byte)*(uint *)cVar2._M_current;
                cVar2._M_current = (uchar *)puVar7;
                switch(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[1]) {
                case '\x10':
                  if ((long)end._M_current - (long)puVar7 < 3) goto switchD_0010c850_caseD_11;
                  cVar2._M_current = local_100._M_current + 5;
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[2] = (byte)*(uint *)(local_100._M_current + 4);
                  if ((long)end._M_current - (long)cVar2._M_current <
                      (long)((ulong)local_f8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start[2] + 4))
                  goto switchD_0010c850_caseD_11;
                  local_100._M_current =
                       cVar2._M_current +
                       (ulong)local_f8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start[2] + 4;
                  break;
                default:
                  goto switchD_0010c850_caseD_11;
                case '\x12':
                  if ((long)end._M_current - (long)puVar7 < 2) goto switchD_0010c850_caseD_11;
                  local_100._M_current = local_100._M_current + 4;
                  break;
                case '\x13':
                  if ((long)end._M_current - (long)puVar7 < 10) goto switchD_0010c850_caseD_11;
                  local_100._M_current = local_100._M_current + 0xc;
                  break;
                case '\x14':
                  if (1 < (long)end._M_current - (long)puVar7) {
                    local_100._M_current = local_100._M_current + 4;
                    midi_event::midi_event(&local_b8,p_timestamp,extended,0,loop_start,0xb);
                    midi_container::add_track_event(local_c0,0,&local_b8);
                    goto LAB_0010c927;
                  }
                  goto switchD_0010c850_caseD_11;
                case '\x15':
                  if ((long)end._M_current - (long)puVar7 < 6) goto switchD_0010c850_caseD_11;
                  local_100._M_current = local_100._M_current + 8;
                  midi_event::midi_event(&local_b8,p_timestamp,extended,0,loop_end,9);
                  midi_container::add_track_event(local_c0,0,&local_b8);
LAB_0010c927:
                  if (local_b8.m_ext_data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_b8.m_ext_data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_b8.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_b8.m_ext_data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                local_101 = 0xff;
              }
              else if (bVar5 == 0xff) {
                if (cVar2._M_current == end._M_current) goto switchD_0010c850_caseD_11;
                local_100._M_current = local_100._M_current + 2;
                local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[1] = (byte)*(uint *)cVar2._M_current;
                uVar13 = decode_delta(&local_100,end);
                cVar2._M_current = local_100._M_current;
                if (((int)uVar13 < 0) ||
                   (uVar11 = (ulong)uVar13,
                   (long)end._M_current - (long)local_100._M_current < (long)uVar11))
                goto switchD_0010c850_caseD_11;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_f8,(ulong)(uVar13 + 2));
                if (uVar13 != 0) {
                  memmove(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2,local_100._M_current,uVar11)
                  ;
                }
                local_100._M_current = local_100._M_current + uVar11;
                p_timestamp_00 = p_timestamp;
                if ((uint)p_timestamp < (uint)uVar17) {
                  p_timestamp_00 = uVar17;
                }
                if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[1] != 0x2f) {
                  p_timestamp_00 = p_timestamp;
                }
                midi_event::midi_event
                          (&local_b8,p_timestamp_00,extended,0,
                           local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(ulong)(uVar13 + 2));
                midi_track::add_event(&local_d8,&local_b8);
                if (local_b8.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_b8.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_b8.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                local_101 = 0xff;
                p_timestamp = p_timestamp_00;
                if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[1] == 0x2f) break;
              }
              else {
                if (0xef < bVar5) goto switchD_0010c850_caseD_11;
                if ((char)bVar5 < '\0') {
                  if (cVar2._M_current == end._M_current) goto switchD_0010c850_caseD_11;
                  local_100._M_current = local_100._M_current + 2;
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[1] = (byte)*(uint *)cVar2._M_current;
                  bVar5 = *local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  local_101 = bVar5;
                }
                else {
                  if (local_101 == 0xff) goto switchD_0010c850_caseD_11;
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[1] = bVar5;
                  *local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start = local_101;
                  bVar5 = *local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
                  local_100._M_current = cVar2._M_current;
                }
                p_data_count = 1;
                if ((bVar5 >> 4) - 0xe < 0xfffffffe) {
                  cVar2._M_current = local_100._M_current;
                  if (local_100._M_current == end._M_current) goto switchD_0010c850_caseD_11;
                  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[2] = *local_100._M_current;
                  p_data_count = 2;
                  local_100._M_current = local_100._M_current + 1;
                }
                p_type = (bVar5 >> 4) + ~extended;
                local_74 = (uint)(bVar5 & 0xf);
                midi_event::midi_event
                          (&local_b8,p_timestamp,p_type,local_74,
                           local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + 1,p_data_count);
                midi_track::add_event(&local_d8,&local_b8);
                if (local_b8.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_b8.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_b8.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (p_type != note_on) goto LAB_0010cb4d;
                local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[2] = 0;
                iVar6 = decode_delta(&local_100,end);
                cVar2._M_current = local_100._M_current;
                if (iVar6 < 0) goto switchD_0010c850_caseD_11;
                uVar13 = iVar6 + (uint)p_timestamp;
                if ((uint)uVar17 < uVar13) {
                  uVar17 = (unsigned_long)uVar13;
                }
                midi_event::midi_event
                          (&local_b8,(ulong)uVar13,note_on,local_74,
                           local_f8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + 1,p_data_count);
                midi_track::add_event(&local_d8,&local_b8);
                uVar12 = uVar17;
                if (local_b8.m_ext_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_b8.m_ext_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_b8.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_b8.m_ext_data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
LAB_0010cb4d:
            } while (local_100._M_current != end._M_current);
          }
          midi_container::add_track(local_c0,&local_d8);
          std::vector<midi_event,_std::allocator<midi_event>_>::~vector(&local_d8.m_events);
          uVar11 = local_50;
          uVar8 = local_70;
        } while (local_50 != local_40);
      }
      if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (byte *)0x0) {
        return uVar8 <= uVar11;
      }
      operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      return uVar8 <= uVar11;
    }
  }
  return false;
}

Assistant:

bool midi_processor::process_hmi( std::vector<uint8_t> const& p_file, midi_container & p_out )
{
    std::vector<uint8_t> buffer;

    std::vector<uint8_t>::const_iterator it = p_file.begin() + 0xE4;

    uint32_t track_count        = it[ 0 ] | ( it[ 1 ] << 8 ) | ( it[ 2 ] << 16 ) | ( it[ 3 ] << 24 );
    uint32_t track_table_offset = it[ 4 ] | ( it[ 5 ] << 8 ) | ( it[ 6 ] << 16 ) | ( it[ 7 ] << 24 );

    if ( track_table_offset >= p_file.size() || track_table_offset + track_count * 4 > p_file.size() )
        return false;

    it = p_file.begin() + track_table_offset;

    std::vector<uint32_t> track_offsets;
    track_offsets.resize( track_count );

    for ( unsigned i = 0; i < track_count; ++i )
    {
        track_offsets[ i ] = it[ 0 ] | ( it[ 1 ] << 8 ) | ( it[ 2 ] << 16 ) | ( it[ 3 ] << 24 );
        it += 4;
    }

    p_out.initialize( 1, 0xC0 );

    {
        midi_track track;
        track.add_event( midi_event( 0, midi_event::extended, 0, hmp_default_tempo, _countof( hmp_default_tempo ) ) );
        track.add_event( midi_event( 0, midi_event::extended, 0, end_of_track, _countof( end_of_track ) ) );
        p_out.add_track( track );
    }

    for ( unsigned i = 0; i < track_count; ++i )
    {
        unsigned track_offset = track_offsets[ i ];
        unsigned long track_length;
        if ( i + 1 < track_count )
        {
            track_length = track_offsets[ i + 1 ] - track_offset;
        }
        else
        {
            track_length = p_file.size() - track_offset;
        }
        if ( track_offset >= p_file.size() || track_offset + track_length > p_file.size() )
            return false;

        std::vector<uint8_t>::const_iterator track_body = p_file.begin() + track_offset;
        std::vector<uint8_t>::const_iterator track_end = track_body + track_length;

        if ( track_length < 13 ) return false;
        if ( track_body[ 0 ] != 'H' || track_body[ 1 ] != 'M' || track_body[ 2 ] != 'I' || track_body[ 3 ] != '-' ||
             track_body[ 4 ] != 'M' || track_body[ 5 ] != 'I' || track_body[ 6 ] != 'D' || track_body[ 7 ] != 'I' ||
             track_body[ 8 ] != 'T' || track_body[ 9 ] != 'R' || track_body[ 10 ] != 'A' || track_body[ 11 ] != 'C' ||
             track_body[ 12 ] != 'K' ) return false;

        midi_track track;
        unsigned current_timestamp = 0;
        unsigned char last_event_code = 0xFF;

        unsigned last_event_timestamp = 0;

        if ( track_length < 0x4B + 4 ) return false;

        uint32_t meta_offset = track_body[ 0x4B ] | ( track_body[ 0x4C ] << 8 ) | ( track_body[ 0x4D ] << 16 ) | ( track_body[ 0x4E ] << 24 );
        if ( meta_offset && meta_offset + 1 < track_length )
        {
            buffer.resize( 2 );
            std::copy( track_body + meta_offset, track_body + meta_offset + 2, buffer.begin() );
            unsigned meta_size = buffer[ 1 ];
            if ( meta_offset + 2 + meta_size > track_length ) return false;
            buffer.resize( meta_size + 2 );
            std::copy( track_body + meta_offset + 2, track_body + meta_offset + 2 + meta_size, buffer.begin() + 2 );
            while ( meta_size > 0 && buffer[ meta_size + 1 ] == ' ' ) --meta_size;
            if ( meta_size > 0 )
            {
                buffer[ 0 ] = 0xFF;
                buffer[ 1 ] = 0x01;
                track.add_event( midi_event( 0, midi_event::extended, 0, &buffer[0], meta_size + 2 ) );
            }
        }

        if ( track_length < 0x57 + 4 ) return false;

        uint32_t track_data_offset = track_body[ 0x57 ] | ( track_body[ 0x58 ] << 8 ) | ( track_body[ 0x59 ] << 16 ) | ( track_body[ 0x5A ] << 24 );

        it = track_body + track_data_offset;

        buffer.resize( 3 );

        while ( it != track_end )
        {
            int delta = decode_delta( it, track_end );
            if ( delta > 0xFFFF || delta < 0 )
            {
                current_timestamp = last_event_timestamp;
                /*console::formatter() << "[foo_midi] Large HMI delta detected, shunting.";*/
            }
            else
            {
                current_timestamp += delta;
                if ( current_timestamp > last_event_timestamp )
                {
                    last_event_timestamp = current_timestamp;
                }
            }

            if ( it == track_end ) return false;
            buffer[ 0 ] = *it++;
            if ( buffer[ 0 ] == 0xFF )
            {
                last_event_code = 0xFF;
                if ( it == track_end ) return false;
                buffer[ 1 ] = *it++;
                int meta_count = decode_delta( it, track_end );
                if ( meta_count < 0 ) return false; /*throw exception_io_data( "Invalid HMI meta message" );*/
                if ( track_end - it < meta_count ) return false;
                buffer.resize( meta_count + 2 );
                std::copy( it, it + meta_count, buffer.begin() + 2 );
                it += meta_count;
                if ( buffer[ 1 ] == 0x2F && last_event_timestamp > current_timestamp )
                {
                    current_timestamp = last_event_timestamp;
                }
                track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], meta_count + 2 ) );
                if ( buffer[ 1 ] == 0x2F ) break;
            }
            else if ( buffer[ 0 ] == 0xF0 )
            {
                last_event_code = 0xFF;
                int system_exclusive_count = decode_delta( it, track_end );
                if ( system_exclusive_count < 0 ) return false; /*throw exception_io_data( "Invalid HMI System Exclusive message" );*/
                if ( track_end - it < system_exclusive_count ) return false;
                buffer.resize( system_exclusive_count + 1 );
                std::copy( it, it + system_exclusive_count, buffer.begin() + 1 );
                it += system_exclusive_count;
                track.add_event( midi_event( current_timestamp, midi_event::extended, 0, &buffer[0], system_exclusive_count + 1 ) );
            }
            else if ( buffer[ 0 ] == 0xFE )
            {
                last_event_code = 0xFF;
                if ( it == track_end ) return false;
                buffer[ 1 ] = *it++;
                if ( buffer[ 1 ] == 0x10 )
                {
                    if ( track_end - it < 3 ) return false;
                    it += 2;
                    buffer[ 2 ] = *it++;
                    if ( track_end - it < buffer[ 2 ] + 4 ) return false;
                    it += buffer[ 2 ] + 4;
                }
                else if ( buffer[ 1 ] == 0x12 )
                {
                    if ( track_end - it < 2 ) return false;
                    it += 2;
                }
                else if ( buffer[ 1 ] == 0x13 )
                {
                    if ( track_end - it < 10 ) return false;
                    it += 10;
                }
                else if ( buffer[ 1 ] == 0x14 )
                {
                    if ( track_end - it < 2 ) return false;
                    it += 2;
                    p_out.add_track_event( 0, midi_event( current_timestamp, midi_event::extended, 0, loop_start, _countof( loop_start ) ) );
                }
                else if ( buffer[ 1 ] == 0x15 )
                {
                    if ( track_end - it < 6 ) return false;
                    it += 6;
                    p_out.add_track_event( 0, midi_event( current_timestamp, midi_event::extended, 0, loop_end, _countof( loop_end ) ) );
                }
                else return false; /*throw exception_io_data( "Unexpected HMI meta event" );*/
            }
            else if ( buffer[ 0 ] <= 0xEF )
            {
                unsigned bytes_read = 1;
                if ( buffer[ 0 ] >= 0x80 )
                {
                    if ( it == track_end ) return false;
                    buffer[ 1 ] = *it++;
                    last_event_code = buffer[ 0 ];
                }
                else
                {
                    if ( last_event_code == 0xFF ) return false; /*throw exception_io_data( "HMI used shortened event after Meta or SysEx message" );*/
                    buffer[ 1 ] = buffer[ 0 ];
                    buffer[ 0 ] = last_event_code;
                }
                midi_event::event_type type = (midi_event::event_type)( ( buffer[ 0 ] >> 4 ) - 8 );
                unsigned channel = buffer[ 0 ] & 0x0F;
                if ( type != midi_event::program_change && type != midi_event::channel_aftertouch )
                {
                    if ( it == track_end ) return false;
                    buffer[ 2 ] = *it++;
                    bytes_read = 2;
                }
                track.add_event( midi_event( current_timestamp, type, channel, &buffer[ 1 ], bytes_read ) );
                if ( type == midi_event::note_on )
                {
                    buffer[ 2 ] = 0x00;
                    int note_length = decode_delta( it, track_end );
                    if ( note_length < 0 ) return false; /*throw exception_io_data( "Invalid HMI note message" );*/
                    unsigned note_end_timestamp = current_timestamp + note_length;
                    if ( note_end_timestamp > last_event_timestamp ) last_event_timestamp = note_end_timestamp;
                    track.add_event( midi_event( note_end_timestamp, midi_event::note_on, channel, &buffer[1], bytes_read ) );
                }
            }
            else return false; /*throw exception_io_data( "Unexpected HMI status code" );*/
        }

        p_out.add_track( track );
    }

    return true;
}